

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_1::TestVertShader::shadeVertices
          (TestVertShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  ulong uVar3;
  int instanceNdx;
  Vec4 color2;
  Vec4 color;
  Vec4 position;
  Vector<float,_4> local_98;
  float local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  rr local_40 [16];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    instanceNdx = this->m_firstInstance + packets[uVar3]->instanceNdx;
    rr::readVertexAttribFloat(local_40,inputs,instanceNdx,packets[uVar3]->vertexNdx);
    rr::readVertexAttribFloat((rr *)&local_50,inputs + 1,instanceNdx,packets[uVar3]->vertexNdx);
    rr::readVertexAttribFloat((rr *)&local_60,inputs + 2,instanceNdx,packets[uVar3]->vertexNdx);
    local_88[0] = ((float)packets[uVar3]->instanceNdx + (float)packets[uVar3]->instanceNdx) /
                  (float)this->m_numInstances;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    local_88[3] = 0.0;
    tcu::operator+((tcu *)&local_78,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_88);
    pVVar1 = packets[uVar3];
    *(undefined8 *)(pVVar1->position).m_data = local_78;
    *(undefined8 *)((pVVar1->position).m_data + 2) = uStack_70;
    local_98.m_data[0] = (float)instanceNdx / (float)this->m_numInstances;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 1.0;
    tcu::operator+((tcu *)local_88,&local_50,&local_98);
    tcu::operator+((tcu *)&local_78,(Vector<float,_4> *)local_88,&local_60);
    pVVar1 = packets[uVar3];
    *(undefined8 *)&pVVar1->outputs[0].v = local_78;
    *(undefined8 *)((long)&pVVar1->outputs[0].v + 8) = uStack_70;
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs,
						rr::VertexPacket* const* packets,
						const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			const int		instanceNdx		= packets[packetNdx]->instanceNdx + m_firstInstance;
			const tcu::Vec4	position		= rr::readVertexAttribFloat(inputs[0], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color			= rr::readVertexAttribFloat(inputs[1], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color2			= rr::readVertexAttribFloat(inputs[2], instanceNdx, packets[packetNdx]->vertexNdx);
			packets[packetNdx]->position	= position + tcu::Vec4((float)(packets[packetNdx]->instanceNdx * 2.0 / m_numInstances), 0.0, 0.0, 0.0);
			packets[packetNdx]->outputs[0]	= color + tcu::Vec4((float)instanceNdx / (float)m_numInstances, 0.0, 0.0, 1.0) + color2;
		}
	}